

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_scale_references(AV1_COMP *cpi,InterpFilter filter,int phase,int use_optimized_scaler)

{
  AV1_COMMON *cm;
  YV12_BUFFER_CONFIG *ybf;
  uint8_t uVar1;
  int iVar2;
  aom_bit_depth_t bd;
  BufferPool *pBVar3;
  SequenceHeader *pSVar4;
  _Bool _Var5;
  int num_planes;
  uint uVar6;
  int iVar7;
  RefCntBuffer *pRVar8;
  RefCntBuffer *pRVar9;
  long lVar10;
  MV_REF *pMVar11;
  uint8_t *puVar12;
  TPL_MV_REF *pTVar13;
  ulong uVar14;
  RefCntBuffer *pRVar15;
  int iVar16;
  pthread_mutex_t *ppVar17;
  char ref_frame;
  long lVar18;
  _Bool _Var19;
  undefined8 *puVar20;
  
  cm = &cpi->common;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  num_planes = (uVar1 == '\0') + 1 + (uint)(uVar1 == '\0');
  lVar18 = 1;
  do {
    if (lVar18 == 8) {
      return;
    }
    if ((cpi->ref_frame_flags & (uint)""[lVar18]) == 0) {
      if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) goto LAB_008fa6d3;
LAB_008fa1df:
      *(undefined8 *)((long)cpi->scaled_ref_buf + ((lVar18 << 0x20) + -0x100000000 >> 0x1d)) = 0;
    }
    else {
      pBVar3 = (cpi->common).buffer_pool;
      ref_frame = (char)lVar18;
      pRVar8 = get_ref_frame_buf(cm,ref_frame);
      if (pRVar8 == (RefCntBuffer *)0x0) goto LAB_008fa1df;
      if (((cpi->ppi->use_svc != 0) && ((cpi->svc).force_zero_mode_spatial_ref != 0)) &&
         ((cpi->ppi->rtc_ref).set_ref_frame_config != 0)) {
        if (ref_frame == '\a') {
          iVar7 = (cpi->svc).skip_mvsearch_altref;
        }
        else {
          uVar6 = (uint)lVar18 & 0xff;
          if (uVar6 == 4) {
            iVar7 = (cpi->svc).skip_mvsearch_gf;
          }
          else {
            if (uVar6 != 1) goto LAB_008fa219;
            iVar7 = (cpi->svc).skip_mvsearch_last;
          }
        }
        if (iVar7 != 0) goto LAB_008fa6d3;
      }
LAB_008fa219:
      iVar7 = is_one_pass_rt_params(cpi);
      if (((iVar7 == 0) || (lVar18 != 4)) ||
         (((cpi->oxcf).superres_cfg.enable_superres == false ||
          ((int)((cpi->common).current_frame.frame_number - 1) <=
           (cpi->rc).frame_num_last_gf_refresh)))) {
        iVar7 = (pRVar8->buf).field_2.field_0.y_crop_width;
        iVar16 = (cpi->common).width;
        if ((iVar7 == iVar16) &&
           ((pRVar8->buf).field_3.field_0.y_crop_height == (cpi->common).height)) {
          pRVar9 = get_ref_frame_buf(cm,ref_frame);
          (pRVar9->buf).field_2.field_0.y_crop_width = iVar7;
          (pRVar9->buf).field_3.field_0.y_crop_height = (pRVar8->buf).field_3.field_0.y_crop_height;
          *(RefCntBuffer **)((long)cpi->scaled_ref_buf + ((lVar18 << 0x20) + -0x100000000 >> 0x1d))
               = pRVar9;
          pRVar9->ref_count = pRVar9->ref_count + 1;
        }
        else {
          if (((iVar16 < iVar7) ||
              ((cpi->common).height < (pRVar8->buf).field_3.field_0.y_crop_height)) &&
             ((pRVar8->buf).border < 0x120)) {
            pRVar9 = get_ref_frame_buf(cm,ref_frame);
            iVar7 = aom_yv12_realloc_with_new_border_c
                              (&pRVar9->buf,0x120,(cpi->common).features.byte_alignment,
                               cpi->alloc_pyramid,num_planes);
            if (iVar7 != 0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate frame buffer");
            }
          }
          lVar10 = (lVar18 << 0x20) + -0x100000000;
          pRVar9 = *(RefCntBuffer **)((long)cpi->scaled_ref_buf + (lVar10 >> 0x1d));
          if (pRVar9 == (RefCntBuffer *)0x0) {
            ppVar17 = (pthread_mutex_t *)(cpi->common).buffer_pool;
            puVar20 = (undefined8 *)(*(long *)((long)ppVar17 + 0x40) + 0x538);
            pthread_mutex_lock(ppVar17);
            ppVar17 = (pthread_mutex_t *)(cpi->common).buffer_pool;
            for (uVar14 = 0; *(uint8_t *)((long)ppVar17 + 0x48) != uVar14; uVar14 = uVar14 + 1) {
              if (*(int *)(puVar20 + -0xa7) == 0) {
                if (*(int *)(puVar20 + -3) != 0) {
                  puVar20[-6] = puVar20[-2];
                  puVar20[-5] = puVar20[-1];
                  puVar20[-4] = *puVar20;
                  *(undefined4 *)(puVar20 + -3) = 0;
                  ppVar17 = (pthread_mutex_t *)(cpi->common).buffer_pool;
                }
                *(undefined4 *)(puVar20 + -0xa7) = 1;
                goto LAB_008fa3e6;
              }
              puVar20 = puVar20 + 0xb1c;
            }
            uVar14 = 0xffffffff;
LAB_008fa3e6:
            pthread_mutex_unlock(ppVar17);
            if ((int)uVar14 == -1) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Unable to find free frame buffer");
            }
            iVar16 = (cpi->common).width;
            iVar7 = (cpi->common).height;
            pRVar15 = pBVar3->frame_bufs + (int)uVar14;
          }
          else {
            iVar2 = (pRVar9->buf).field_2.field_0.y_crop_width;
            iVar16 = (cpi->common).width;
            iVar7 = (cpi->common).height;
            pRVar15 = pRVar9;
            if ((iVar2 == iVar16) &&
               (iVar16 = iVar2, (pRVar9->buf).field_3.field_0.y_crop_height == iVar7))
            goto LAB_008fa6d3;
          }
          ybf = &pRVar15->buf;
          pSVar4 = (cpi->common).seq_params;
          iVar7 = aom_realloc_frame_buffer
                            (ybf,iVar16,iVar7,pSVar4->subsampling_x,pSVar4->subsampling_y,
                             (uint)pSVar4->use_highbitdepth,0x120,
                             (cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                             (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,false,0);
          if (iVar7 != 0) {
            if (pRVar9 == (RefCntBuffer *)0x0) {
              pRVar15->ref_count = pRVar15->ref_count + -1;
            }
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          _Var5 = av1_has_optimized_scaler
                            ((pRVar8->buf).field_2.field_0.y_crop_width,
                             (pRVar8->buf).field_3.field_0.y_crop_height,
                             (pRVar15->buf).field_2.field_0.y_crop_width,
                             (pRVar15->buf).field_3.field_0.y_crop_height);
          _Var19 = uVar1 != '\0' && _Var5;
          if ((uVar1 == '\0') && (_Var5)) {
            _Var19 = av1_has_optimized_scaler
                               ((pRVar8->buf).field_2.field_0.uv_crop_width,
                                (pRVar8->buf).field_3.field_0.uv_crop_height,
                                (pRVar15->buf).field_2.field_0.uv_crop_width,
                                (pRVar15->buf).field_3.field_0.uv_crop_height);
          }
          bd = ((cpi->common).seq_params)->bit_depth;
          if (((bd == AOM_BITS_8 && use_optimized_scaler != 0) & _Var19) == 1) {
            (*av1_resize_and_extend_frame)(&pRVar8->buf,ybf,filter,phase,num_planes);
          }
          else {
            _Var5 = av1_resize_and_extend_frame_nonnormative(&pRVar8->buf,ybf,bd,num_planes);
            if (!_Var5) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate buffer during resize");
            }
          }
          cpi->scaled_ref_buf[lVar10 >> 0x20] = pRVar15;
          if (((pRVar15->mvs == (MV_REF *)0x0) ||
              (pRVar15->mi_rows != (cpi->common).mi_params.mi_rows)) ||
             (pRVar15->mi_cols != (cpi->common).mi_params.mi_cols)) {
            aom_free(pRVar15->mvs);
            iVar7 = (cpi->common).mi_params.mi_rows;
            pRVar15->mi_rows = iVar7;
            iVar16 = (cpi->common).mi_params.mi_cols;
            pRVar15->mi_cols = iVar16;
            pMVar11 = (MV_REF *)aom_calloc((long)((iVar16 + 1 >> 1) * (iVar7 + 1 >> 1)),8);
            pRVar15->mvs = pMVar11;
            if (pMVar11 == (MV_REF *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate buf->mvs");
            }
            aom_free(pRVar15->seg_map);
            puVar12 = (uint8_t *)
                      aom_calloc((long)(cpi->common).mi_params.mi_cols *
                                 (long)(cpi->common).mi_params.mi_rows,1);
            pRVar15->seg_map = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate buf->seg_map");
            }
          }
          iVar7 = ((cpi->common).mi_params.mi_stride >> 1) *
                  ((cpi->common).mi_params.mi_rows + 0x20 >> 1);
          pTVar13 = (cpi->common).tpl_mvs;
          if ((pTVar13 == (TPL_MV_REF *)0x0) || ((cpi->common).tpl_mvs_mem_size < iVar7)) {
            aom_free(pTVar13);
            pTVar13 = (TPL_MV_REF *)aom_calloc((long)iVar7,8);
            (cpi->common).tpl_mvs = pTVar13;
            if (pTVar13 == (TPL_MV_REF *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cm->tpl_mvs");
            }
            (cpi->common).tpl_mvs_mem_size = iVar7;
          }
          iVar7 = (cpi->common).height;
          pRVar15->width = (cpi->common).width;
          pRVar15->height = iVar7;
        }
      }
    }
LAB_008fa6d3:
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

void av1_scale_references(AV1_COMP *cpi, const InterpFilter filter,
                          const int phase, const int use_optimized_scaler) {
  AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      BufferPool *const pool = cm->buffer_pool;
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // For RTC-SVC: if force_zero_mode_spatial_ref is enabled, check if the
      // motion search can be skipped for the references: last, golden, altref.
      // If so, we can skip scaling that reference.
      if (cpi->ppi->use_svc && cpi->svc.force_zero_mode_spatial_ref &&
          cpi->ppi->rtc_ref.set_ref_frame_config) {
        if (ref_frame == LAST_FRAME && cpi->svc.skip_mvsearch_last) continue;
        if (ref_frame == GOLDEN_FRAME && cpi->svc.skip_mvsearch_gf) continue;
        if (ref_frame == ALTREF_FRAME && cpi->svc.skip_mvsearch_altref)
          continue;
      }
      // For RTC with superres on: golden reference only needs to be scaled
      // if it was refreshed in previous frame.
      if (is_one_pass_rt_params(cpi) &&
          cpi->oxcf.superres_cfg.enable_superres && ref_frame == GOLDEN_FRAME &&
          cpi->rc.frame_num_last_gf_refresh <
              (int)cm->current_frame.frame_number - 1) {
        continue;
      }

      if (ref->y_crop_width != cm->width || ref->y_crop_height != cm->height) {
        // Replace the reference buffer with a copy having a thicker border,
        // if the reference buffer is higher resolution than the current
        // frame, and the border is thin.
        if ((ref->y_crop_width > cm->width ||
             ref->y_crop_height > cm->height) &&
            ref->border < AOM_BORDER_IN_PIXELS) {
          RefCntBuffer *ref_fb = get_ref_frame_buf(cm, ref_frame);
          if (aom_yv12_realloc_with_new_border(
                  &ref_fb->buf, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, cpi->alloc_pyramid,
                  num_planes) != 0) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
        }
        int force_scaling = 0;
        RefCntBuffer *new_fb = cpi->scaled_ref_buf[ref_frame - 1];
        if (new_fb == NULL) {
          const int new_fb_idx = get_free_fb(cm);
          if (new_fb_idx == INVALID_IDX) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Unable to find free frame buffer");
          }
          force_scaling = 1;
          new_fb = &pool->frame_bufs[new_fb_idx];
        }

        if (force_scaling || new_fb->buf.y_crop_width != cm->width ||
            new_fb->buf.y_crop_height != cm->height) {
          if (aom_realloc_frame_buffer(
                  &new_fb->buf, cm->width, cm->height,
                  cm->seq_params->subsampling_x, cm->seq_params->subsampling_y,
                  cm->seq_params->use_highbitdepth, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, NULL, NULL, NULL, false, 0)) {
            if (force_scaling) {
              // Release the reference acquired in the get_free_fb() call above.
              --new_fb->ref_count;
            }
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          bool has_optimized_scaler = av1_has_optimized_scaler(
              ref->y_crop_width, ref->y_crop_height, new_fb->buf.y_crop_width,
              new_fb->buf.y_crop_height);
          if (num_planes > 1) {
            has_optimized_scaler =
                has_optimized_scaler &&
                av1_has_optimized_scaler(
                    ref->uv_crop_width, ref->uv_crop_height,
                    new_fb->buf.uv_crop_width, new_fb->buf.uv_crop_height);
          }
#if CONFIG_AV1_HIGHBITDEPTH
          if (use_optimized_scaler && has_optimized_scaler &&
              cm->seq_params->bit_depth == AOM_BITS_8) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#else
          if (use_optimized_scaler && has_optimized_scaler) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#endif
          cpi->scaled_ref_buf[ref_frame - 1] = new_fb;
          alloc_frame_mvs(cm, new_fb);
        }
      } else {
        RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
        buf->buf.y_crop_width = ref->y_crop_width;
        buf->buf.y_crop_height = ref->y_crop_height;
        cpi->scaled_ref_buf[ref_frame - 1] = buf;
        ++buf->ref_count;
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}